

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Impl * __thiscall
mp::BasicExprFactory<std::allocator<char>>::
Allocate<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,int extra_bytes)

{
  Impl *pIVar1;
  Impl *local_20;
  
  local_20 = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)(this + 8),&local_20);
  pIVar1 = (Impl *)operator_new__(-(ulong)((long)extra_bytes + 0x10U >> 0x3d != 0) |
                                  (long)extra_bytes * 8 + 0x80U);
  (pIVar1->super_Impl).kind_ = kind;
  *(Impl **)(*(long *)(this + 0x10) + -8) = pIVar1;
  return pIVar1;
}

Assistant:

typename ExprType::Impl *Allocate(expr::Kind kind, int extra_bytes = 0) {
    /// Call push_back first to make sure that the impl pointer doesn't leak
    /// if push_back throws an exception.
    exprs_.push_back(0);
    typedef typename ExprType::Impl Impl;
    /// The following cannot overflow.
    /// Using `~new` due to #174
    Impl *impl = (Impl*) new char* [sizeof(Impl) + extra_bytes];
    impl->kind_ = kind;
    exprs_.back() = impl;
    return impl;
  }